

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate.c
# Opt level: O3

void dsRunLogCallback(char *fmt,...)

{
  dsLogCallback p_Var1;
  void *pvVar2;
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  __va_list_tag local_f8;
  undefined1 local_d8 [8];
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  
  if (in_AL != '\0') {
    local_a8 = in_XMM0_Qa;
    local_98 = in_XMM1_Qa;
    local_88 = in_XMM2_Qa;
    local_78 = in_XMM3_Qa;
    local_68 = in_XMM4_Qa;
    local_58 = in_XMM5_Qa;
    local_48 = in_XMM6_Qa;
    local_38 = in_XMM7_Qa;
  }
  if (logCallback != (dsLogCallback)0x0) {
    local_d0 = in_RSI;
    local_c8 = in_RDX;
    local_c0 = in_RCX;
    local_b8 = in_R8;
    local_b0 = in_R9;
    pthread_rwlock_rdlock((pthread_rwlock_t *)&logLock);
    pvVar2 = logUserPtr;
    p_Var1 = logCallback;
    pthread_rwlock_unlock((pthread_rwlock_t *)&logLock);
    local_f8.gp_offset = 8;
    local_f8.fp_offset = 0x30;
    local_f8.overflow_arg_area = &ap[0].overflow_arg_area;
    local_f8.reg_save_area = local_d8;
    (*p_Var1)(pvVar2,fmt,&local_f8);
  }
  return;
}

Assistant:

void
dsRunLogCallback(const char *fmt, ...)
{
	va_list ap;
	dsLogCallback callback;
	void *userPtr;

	if (logCallback == NULL) {
		return;
	}

	pthread_rwlock_rdlock(&logLock);
	callback = logCallback;
	userPtr = logUserPtr;
	pthread_rwlock_unlock(&logLock);

	va_start(ap, fmt);
	callback(userPtr, fmt, ap);
	va_end(ap);
}